

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O1

void __thiscall dlib::tooltip::disable(tooltip *this)

{
  data *pdVar1;
  auto_mutex M;
  auto_mutex local_20;
  
  local_20.r = (this->super_mouse_over_event).super_drawable.m;
  local_20.m = (mutex *)0x0;
  local_20.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_20.r,1);
  drawable::disable((drawable *)this);
  pdVar1 = (this->stuff)._M_t.
           super___uniq_ptr_impl<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>.
           _M_t.
           super__Tuple_impl<0UL,_dlib::tooltip::data_*,_std::default_delete<dlib::tooltip::data>_>.
           super__Head_base<0UL,_dlib::tooltip::data_*,_false>._M_head_impl;
  if (pdVar1 != (data *)0x0) {
    timer<dlib::tooltip>::stop(&pdVar1->tt_timer);
    base_window::hide(&(((this->stuff)._M_t.
                         super___uniq_ptr_impl<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dlib::tooltip::data_*,_std::default_delete<dlib::tooltip::data>_>
                         .super__Head_base<0UL,_dlib::tooltip::data_*,_false>._M_head_impl)->win).
                       super_base_window);
  }
  auto_mutex::unlock(&local_20);
  return;
}

Assistant:

void disable (
        )
        {
            auto_mutex M(m);
            mouse_over_event::disable();
            if (stuff)
            {
                stuff->tt_timer.stop();
                stuff->win.hide();
            }
        }